

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QGridLayoutItem_*> * __thiscall
QList<QGridLayoutItem_*>::fill(QList<QGridLayoutItem_*> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  QGridLayoutItem **ppQVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  QGridLayoutItem *copy;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  lVar6 = newSize;
  if (pDVar1 != (Data *)0x0) {
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1 == (Data *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = (pDVar1->super_QArrayData).alloc;
      }
      if (newSize <= lVar7) {
        lVar6 = (this->d).size;
        if (newSize <= lVar6) {
          lVar6 = newSize;
        }
        if (lVar6 != 0) {
          ppQVar5 = (this->d).ptr;
          lVar7 = 0;
          do {
            *(parameter_type *)((long)ppQVar5 + lVar7) = t;
            lVar7 = lVar7 + 8;
          } while (lVar6 * 8 != lVar7);
        }
        lVar6 = (this->d).size;
        lVar7 = newSize - lVar6;
        if (lVar7 == 0 || newSize < lVar6) {
          if (newSize < lVar6) {
            (this->d).size = newSize;
          }
        }
        else {
          ppQVar5 = (this->d).ptr;
          (this->d).size = newSize;
          auVar4 = _DAT_00684850;
          auVar3 = _DAT_00684840;
          lVar8 = lVar7 + -1;
          auVar12._8_4_ = (int)lVar8;
          auVar12._0_8_ = lVar8;
          auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar9 = 0;
          auVar12 = auVar12 ^ _DAT_00684850;
          do {
            auVar13._8_4_ = (int)uVar9;
            auVar13._0_8_ = uVar9;
            auVar13._12_4_ = (int)(uVar9 >> 0x20);
            auVar13 = (auVar13 | auVar3) ^ auVar4;
            if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                        auVar12._4_4_ < auVar13._4_4_) & 1)) {
              ppQVar5[lVar6 + uVar9] = t;
            }
            if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
                auVar13._12_4_ <= auVar12._12_4_) {
              ppQVar5[lVar6 + uVar9 + 1] = t;
            }
            uVar9 = uVar9 + 2;
          } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar9);
        }
        goto LAB_0054512e;
      }
    }
    if (pDVar1 != (Data *)0x0) {
      lVar6 = (pDVar1->super_QArrayData).alloc;
      if (lVar6 <= newSize) {
        lVar6 = newSize;
      }
      if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
        lVar6 = newSize;
      }
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppQVar5 = (QGridLayoutItem **)QArrayData::allocate(&local_30,8,0x10,lVar6,KeepSize);
  auVar4 = _DAT_00684850;
  auVar3 = _DAT_00684840;
  if (newSize == 0) {
    newSize = 0;
  }
  else {
    lVar6 = newSize + -1;
    auVar10._8_4_ = (int)lVar6;
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_00684850;
    do {
      auVar11._8_4_ = (int)uVar9;
      auVar11._0_8_ = uVar9;
      auVar11._12_4_ = (int)(uVar9 >> 0x20);
      auVar12 = (auVar11 | auVar3) ^ auVar4;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        ppQVar5[uVar9] = t;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        ppQVar5[uVar9 + 1] = t;
      }
      uVar9 = uVar9 + 2;
    } while ((newSize + 1U & 0xfffffffffffffffe) != uVar9);
  }
  pQVar2 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = ppQVar5;
  (this->d).size = newSize;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
LAB_0054512e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}